

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::ServiceOptions::ServiceOptions(ServiceOptions *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__ServiceOptions_0042c490;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ = 0;
  if (this != (ServiceOptions *)&_ServiceOptions_default_instance_) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  this->deprecated_ = false;
  return;
}

Assistant:

ServiceOptions::ServiceOptions()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.ServiceOptions)
}